

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importPBRT.cpp
# Opt level: O2

SP pbrt::importPBRT(string *fileName,string *basePath)

{
  __shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  runtime_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  SP SVar6;
  SP pbrt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  __shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> local_188;
  shared_ptr<pbrt::syntactic::Camera> cam;
  
  pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cam,".pbrt",(allocator<char> *)&local_238);
  bVar4 = endsWith(basePath,(string *)&cam);
  std::__cxx11::string::~string((string *)&cam);
  if (bVar4) {
    syntactic::Scene::parse((string *)&cam,basePath);
    std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2> *)&cam);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_188,
               &pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>);
    SemanticParser::SemanticParser((SemanticParser *)&cam,(SP *)&local_188);
    _Var3 = cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (fileName->_M_dataplus)._M_p =
         (pointer)cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    fileName->_M_string_length = (size_type)_Var3._M_pi;
    cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    SemanticParser::~SemanticParser((SemanticParser *)&cam);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_198,(__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)fileName);
    std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,
               &pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>);
    createFilm((SP *)&local_198,(SP *)&local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b8,(__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)fileName);
    std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,
               &pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>);
    createSampler((SP *)&local_1b8,(SP *)&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d8,(__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)fileName);
    std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1e8,
               &pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>);
    createIntegrator((SP *)&local_1d8,(SP *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
    std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1f8,(__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)fileName);
    std::__shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_208,
               &pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>);
    createPixelFilter((SP *)&local_1f8,(SP *)&local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
    p_Var1 = &(((pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->cameras).
               super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var5 = &(((pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->cameras).
                    super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>;
        p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
      std::__shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>,p_Var5
                );
      pcVar2 = (fileName->_M_dataplus)._M_p;
      std::__shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_218,
                 &cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>);
      createCamera((pbrt *)&local_238,(SP *)&local_218);
      std::vector<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>>::
      emplace_back<std::shared_ptr<pbrt::Camera>>
                ((vector<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>>
                  *)(pcVar2 + 0x18),(shared_ptr<pbrt::Camera> *)&local_238);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_238._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cam.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pbrt.super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SVar6.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    SVar6.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)fileName;
    return (SP)SVar6.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_238,"could not detect input file format!? (unknown extension in \'",basePath
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cam,
                 &local_238,"\')");
  std::runtime_error::runtime_error(this,(string *)&cam);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Scene::SP importPBRT(const std::string &fileName, const std::string &basePath)
  {
    pbrt::syntactic::Scene::SP pbrt;
    if (endsWith(fileName,".pbrt"))
      pbrt = pbrt::syntactic::Scene::parse(fileName, basePath);
    else
      throw std::runtime_error("could not detect input file format!? (unknown extension in '"+fileName+"')");
      
    Scene::SP scene = SemanticParser(pbrt).result;
    createFilm(scene,pbrt);
    createSampler(scene,pbrt);
    createIntegrator(scene,pbrt);
    createPixelFilter(scene,pbrt);
    for (auto cam : pbrt->cameras)
      scene->cameras.push_back(createCamera(cam));
    return scene;
  }